

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void StrVariableCommand(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  int iVar3;
  byte *str;
  byte *dest;
  undefined8 *in_RSI;
  IResult *in_RDI;
  long in_FS_OFFSET;
  int Size;
  int Length;
  char *pString;
  CStrVariableData *pData;
  char Temp [4];
  char aBuf [1024];
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  char *in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc00;
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = IConsole::IResult::NumArguments(in_RDI);
  if (iVar2 == 0) {
    str_format(&stack0xfffffffffffffbf8,0x400,"Value: %s",in_RSI[1]);
    (**(code **)(*(long *)*in_RSI + 200))((long *)*in_RSI,0,"console",&stack0xfffffffffffffbf8);
    str_copy(in_stack_fffffffffffffbd0,
             (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),0);
  }
  else {
    iVar2 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
    str = (byte *)CONCAT44(extraout_var,iVar2);
    iVar2 = str_utf8_check((char *)str);
    if (iVar2 == 0) {
      iVar2 = 0;
      while (*str != 0) {
        dest = str + 1;
        iVar3 = str_utf8_encode(&stack0xfffffffffffffbf4,(uint)*str);
        if (*(int *)(in_RSI + 2) <= iVar2 + iVar3) break;
        mem_copy(dest,(void *)CONCAT44(iVar2,iVar3),0);
        iVar2 = iVar3 + iVar2;
        str = dest;
      }
      *(undefined1 *)(in_RSI[1] + (long)iVar2) = 0;
    }
    else {
      str_utf8_copy_num(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                        in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void StrVariableCommand(IConsole::IResult *pResult, void *pUserData)
{
	CStrVariableData *pData = (CStrVariableData *)pUserData;

	if(pResult->NumArguments())
	{
		const char *pString = pResult->GetString(0);
		if(!str_utf8_check(pString))
		{
			char Temp[4];
			int Length = 0;
			while(*pString)
			{
				int Size = str_utf8_encode(Temp, static_cast<unsigned char>(*pString++));
				if(Length+Size < pData->m_MaxSize)
				{
					mem_copy(pData->m_pStr+Length, &Temp, Size);
					Length += Size;
				}
				else
					break;
			}
			pData->m_pStr[Length] = 0;
		}
		else
			str_utf8_copy_num(pData->m_pStr, pString, pData->m_MaxSize, pData->m_Length);
	}
	else
	{
		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "Value: %s", pData->m_pStr);
		pData->m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		str_copy(pResult->m_aValue, pData->m_pStr, sizeof(pResult->m_aValue));
	}
}